

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasCordFields(Descriptor *descriptor,Options *options)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *field;
  Descriptor *descriptor_00;
  int local_28;
  int local_24;
  int i_1;
  int i;
  Options *options_local;
  Descriptor *descriptor_local;
  
  local_24 = 0;
  while( true ) {
    iVar2 = Descriptor::field_count(descriptor);
    if (iVar2 <= local_24) {
      local_28 = 0;
      while( true ) {
        iVar2 = Descriptor::nested_type_count(descriptor);
        if (iVar2 <= local_28) {
          return false;
        }
        descriptor_00 = Descriptor::nested_type(descriptor,local_28);
        bVar1 = HasCordFields(descriptor_00,options);
        if (bVar1) break;
        local_28 = local_28 + 1;
      }
      return true;
    }
    field = Descriptor::field(descriptor,local_24);
    bVar1 = IsCordField(field,options);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

static bool HasCordFields(const Descriptor* descriptor,
                          const Options& options) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (IsCordField(descriptor->field(i), options)) return true;
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasCordFields(descriptor->nested_type(i), options)) return true;
  }
  return false;
}